

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

void Cba_ManWriteConcat(Cba_Ntk_t *p,int iObj)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  Vec_Str_t *p_00;
  int iVar4;
  
  p_00 = &p->pDesign->vOut;
  iVar2 = Cba_ObjIsConcat(p,iObj);
  if (iVar2 != 0) {
    Vec_StrPush(p_00,'{');
    iVar2 = Cba_ObjFin0(p,iObj);
    iVar4 = 0;
    while( true ) {
      iVar3 = Cba_ObjFin0(p,iObj + 1);
      if (iVar3 <= iVar2 + iVar4) break;
      iVar3 = Cba_FinFon(p,iVar2 + iVar4);
      pcVar1 = "    \"%s\", ";
      if (iVar4 == 0) {
        pcVar1 = "T = %d\t\t";
      }
      Vec_StrPrintStr(p_00,pcVar1 + 8);
      Cba_ManWriteFonName(p,iVar3,1,0);
      iVar4 = iVar4 + 1;
    }
    Vec_StrPush(p_00,'}');
    return;
  }
  __assert_fail("Cba_ObjIsConcat(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaWriteVer.c"
                ,0x1ae,"void Cba_ManWriteConcat(Cba_Ntk_t *, int)");
}

Assistant:

void Cba_ManWriteConcat( Cba_Ntk_t * p, int iObj )
{
    int i, iFin, iFon;
    Vec_Str_t * vStr = &p->pDesign->vOut;
    assert( Cba_ObjIsConcat(p, iObj) );
    Vec_StrPush( vStr, '{' );
    Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
    {
        Vec_StrPrintStr( vStr, i ? ", " : "" );
        Cba_ManWriteFonName( p, iFon, 1, 0 );
    }
    Vec_StrPush( vStr, '}' );
}